

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O1

string * __thiscall
OpenMD::StringTokenizer::peekNextToken_abi_cxx11_
          (string *__return_storage_ptr__,StringTokenizer *this)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  paVar4 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (this->currentPos_)._M_current;
  if ((this->end_)._M_current != pcVar2) {
    if ((this->end_)._M_current != pcVar2) {
      do {
        lVar1 = std::__cxx11::string::find((char)this + ' ',(ulong)(uint)(int)*pcVar2);
        if (lVar1 == -1) break;
        if (this->returnTokens_ == true) {
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,
                     (long)paVar4 - (long)(__return_storage_ptr__->_M_dataplus)._M_p,0,'\x01');
          return __return_storage_ptr__;
        }
        pcVar2 = pcVar2 + 1;
      } while (pcVar2 != (this->end_)._M_current);
    }
    if (pcVar2 != (this->end_)._M_current) {
      do {
        lVar1 = std::__cxx11::string::find((char)this + ' ',(ulong)(uint)(int)*pcVar2);
        if (lVar1 != -1) {
          return __return_storage_ptr__;
        }
        uVar3 = (long)paVar4 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
        std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,uVar3,0,'\x01');
        pcVar2 = pcVar2 + 1;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((__return_storage_ptr__->_M_dataplus)._M_p + uVar3 + 1);
      } while (pcVar2 != (this->end_)._M_current);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringTokenizer::peekNextToken() {
    std::string result;
    std::string::const_iterator tmpIter = currentPos_;

    if (tmpIter != end_) {
      std::insert_iterator<std::string> insertIter(result, result.begin());

      while (tmpIter != end_ && isDelimiter(*tmpIter)) {
        if (returnTokens_) {
          *insertIter++ = *tmpIter++;
          return result;
        }

        ++tmpIter;
      }

      while (tmpIter != end_ && !isDelimiter(*tmpIter)) {
        *insertIter++ = *tmpIter++;
      }
    }

    return result;
  }